

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O0

int woff2::NumGlyphs(Font *font)

{
  int iVar1;
  uint uVar2;
  Table *pTVar3;
  Table *pTVar4;
  int loca_record_size;
  int index_fmt;
  Table *loca_table;
  Table *head_table;
  Font *font_local;
  
  pTVar3 = Font::FindTable(font,0x68656164);
  pTVar4 = Font::FindTable(font,0x6c6f6361);
  if (((pTVar3 == (Table *)0x0) || (pTVar4 == (Table *)0x0)) || (pTVar3->length < 0x34)) {
    font_local._4_4_ = 0;
  }
  else {
    iVar1 = IndexFormat(font);
    uVar2 = 4;
    if (iVar1 == 0) {
      uVar2 = 2;
    }
    if (pTVar4->length < uVar2) {
      font_local._4_4_ = 0;
    }
    else {
      font_local._4_4_ = pTVar4->length / uVar2 - 1;
    }
  }
  return font_local._4_4_;
}

Assistant:

int NumGlyphs(const Font& font) {
  const Font::Table* head_table = font.FindTable(kHeadTableTag);
  const Font::Table* loca_table = font.FindTable(kLocaTableTag);
  if (head_table == NULL || loca_table == NULL || head_table->length < 52) {
    return 0;
  }
  int index_fmt = IndexFormat(font);
  int loca_record_size = (index_fmt == 0 ? 2 : 4);
  if (loca_table->length < loca_record_size) {
    return 0;
  }
  return (loca_table->length / loca_record_size) - 1;
}